

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O2

bool __thiscall CDirectiveArea::Validate(CDirectiveArea *this,ValidateState *state)

{
  int64_t *dest;
  int64_t *dest_00;
  long position;
  long space;
  long lVar1;
  CAssemblerCommand *pCVar2;
  long lVar3;
  long fileID;
  bool bVar4;
  int iVar5;
  Architecture *pAVar6;
  int64_t iVar7;
  long lVar8;
  byte bVar9;
  char *text;
  ValidateState contentValidation;
  
  position = this->position;
  space = this->areaSize;
  lVar1 = this->contentSize;
  dest = &this->position;
  if ((this->positionExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    iVar7 = FileManager::getVirtualAddress(g_fileManager);
    *dest = iVar7;
  }
  else {
    bVar4 = Expression::evaluateInteger<long>(&this->positionExpression,dest);
    if (!bVar4) {
      text = "Invalid position expression";
      goto LAB_00171dcc;
    }
    pAVar6 = Architecture::current();
    (*pAVar6->_vptr_Architecture[3])(pAVar6);
    FileManager::seekVirtual(g_fileManager,*dest);
  }
  dest_00 = &this->areaSize;
  bVar4 = Expression::evaluateInteger<long>(&this->sizeExpression,dest_00);
  if (!bVar4) {
    text = "Invalid size expression";
LAB_00171dcc:
    Logger::queueError<>(Error,text);
    return false;
  }
  if (*dest_00 < 0) {
    text = "Negative area size";
    goto LAB_00171dcc;
  }
  if (((this->fillExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     (bVar4 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillValue),
     !bVar4)) {
    text = "Invalid fill expression";
    goto LAB_00171dcc;
  }
  pCVar2 = (this->content)._M_t.
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  if (pCVar2 == (CAssemblerCommand *)0x0) {
    bVar9 = 0;
  }
  else {
    contentValidation.passes = state->passes;
    contentValidation._20_4_ = *(undefined4 *)&state->field_0x14;
    contentValidation._1_7_ = SUB87((ulong)*(undefined8 *)state >> 8,0);
    contentValidation.noFileChange = true;
    contentValidation.noFileChangeDirective = "area";
    CAssemblerCommand::applyFileInfo(pCVar2);
    pCVar2 = (this->content)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    iVar5 = (*pCVar2->_vptr_CAssemblerCommand[2])(pCVar2,&contentValidation);
    bVar9 = (byte)iVar5;
  }
  iVar7 = FileManager::getVirtualAddress(g_fileManager);
  this->contentSize = iVar7 - this->position;
  CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
  lVar8 = this->contentSize - this->areaSize;
  if (lVar8 != 0 && this->areaSize <= this->contentSize) {
    contentValidation._0_8_ = lVar8;
    Logger::queueError<long,long>
              (Error,"Area at %08x overflowed by %d bytes",dest,(long *)&contentValidation);
  }
  if (((this->fillExpression).expression.
       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) || ((this->super_CAssemblerCommand).field_0x14 == '\x01')) {
    FileManager::advanceMemory(g_fileManager,this->areaSize - this->contentSize);
  }
  lVar8 = this->areaSize;
  lVar3 = this->contentSize;
  fileID = this->fileID;
  iVar7 = FileManager::getOpenFileID(g_fileManager);
  this->fileID = iVar7;
  if ((fileID == iVar7) && (position == this->position)) {
    iVar7 = *dest_00;
    if (iVar7 != 0 || space == 0) goto LAB_00171eba;
LAB_00171ea6:
    Allocations::forgetArea(fileID,position,space);
  }
  else if (space != 0) goto LAB_00171ea6;
  iVar7 = *dest_00;
LAB_00171eba:
  bVar9 = bVar9 | (lVar1 != lVar3 || lVar8 != space);
  if (iVar7 == 0) {
    return (bool)bVar9;
  }
  Allocations::setArea
            (this->fileID,this->position,iVar7,this->contentSize,
             (this->fillExpression).expression.
             super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0,(bool)(this->super_CAssemblerCommand).field_0x14);
  return (bool)bVar9;
}

Assistant:

bool CDirectiveArea::Validate(const ValidateState &state)
{
	int64_t oldAreaSize = areaSize;
	int64_t oldContentSize = contentSize;
	int64_t oldPosition = position;

	if (positionExpression.isLoaded())
	{
		if (!positionExpression.evaluateInteger(position))
		{
			Logger::queueError(Logger::Error, "Invalid position expression");
			return false;
		}
		Architecture::current().NextSection();
		g_fileManager->seekVirtual(position);
	}
	else
		position = g_fileManager->getVirtualAddress();

	if (!sizeExpression.evaluateInteger(areaSize))
	{
		Logger::queueError(Logger::Error, "Invalid size expression");
		return false;
	}

	if (areaSize < 0)
	{
		Logger::queueError(Logger::Error, "Negative area size");
		return false;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillValue))
		{
			Logger::queueError(Logger::Error, "Invalid fill expression");
			return false;
		}
	}

	bool result = false;
	if (content)
	{
		ValidateState contentValidation = state;
		contentValidation.noFileChange = true;
		contentValidation.noFileChangeDirective = "area";
		content->applyFileInfo();
		result = content->Validate(contentValidation);
	}
	contentSize = g_fileManager->getVirtualAddress()-position;

	// restore info of this command
	applyFileInfo();

	if (areaSize < contentSize)
	{
		Logger::queueError(Logger::Error, "Area at %08x overflowed by %d bytes", position, contentSize - areaSize);
	}

	if (fillExpression.isLoaded() || shared)
		g_fileManager->advanceMemory(areaSize-contentSize);

	if (areaSize != oldAreaSize || contentSize != oldContentSize)
		result = true;

	int64_t oldFileID = fileID;
	fileID = g_fileManager->getOpenFileID();

	if ((oldFileID != fileID || oldPosition != position || areaSize == 0) && oldAreaSize != 0)
		Allocations::forgetArea(oldFileID, oldPosition, oldAreaSize);
	if (areaSize != 0)
		Allocations::setArea(fileID, position, areaSize, contentSize, fillExpression.isLoaded(), shared);

	return result;
}